

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O0

boolean skip_variable(j_decompress_ptr cinfo)

{
  byte bVar1;
  undefined8 *puVar2;
  int iVar3;
  long lVar4;
  long *in_RDI;
  size_t bytes_in_buffer;
  JOCTET *next_input_byte;
  jpeg_source_mgr *datasrc;
  JLONG length;
  long local_30;
  byte *local_28;
  
  puVar2 = (undefined8 *)in_RDI[5];
  local_28 = (byte *)*puVar2;
  local_30 = puVar2[1];
  if (local_30 == 0) {
    iVar3 = (*(code *)puVar2[3])(in_RDI);
    if (iVar3 == 0) {
      return 0;
    }
    local_28 = (byte *)*puVar2;
    local_30 = puVar2[1];
  }
  local_30 = local_30 + -1;
  bVar1 = *local_28;
  local_28 = local_28 + 1;
  if (local_30 == 0) {
    iVar3 = (*(code *)puVar2[3])(in_RDI);
    if (iVar3 == 0) {
      return 0;
    }
    local_28 = (byte *)*puVar2;
    local_30 = puVar2[1];
  }
  lVar4 = (ulong)*local_28 + (ulong)bVar1 * 0x100 + -2;
  *(undefined4 *)(*in_RDI + 0x28) = 0x5b;
  *(undefined4 *)(*in_RDI + 0x2c) = *(undefined4 *)((long)in_RDI + 0x21c);
  *(int *)(*in_RDI + 0x30) = (int)lVar4;
  (**(code **)(*in_RDI + 8))(in_RDI,1);
  *puVar2 = local_28 + 1;
  puVar2[1] = local_30 + -1;
  if (0 < lVar4) {
    (**(code **)(in_RDI[5] + 0x20))(in_RDI,lVar4);
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
skip_variable(j_decompress_ptr cinfo)
/* Skip over an unknown or uninteresting variable-length marker */
{
  JLONG length;
  INPUT_VARS(cinfo);

  INPUT_2BYTES(cinfo, length, return FALSE);
  length -= 2;

  TRACEMS2(cinfo, 1, JTRC_MISC_MARKER, cinfo->unread_marker, (int)length);

  INPUT_SYNC(cinfo);            /* do before skip_input_data */
  if (length > 0)
    (*cinfo->src->skip_input_data) (cinfo, (long)length);

  return TRUE;
}